

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Testany(int count,MPIABI_Request *array_of_requests,int *indx,int *flag,
                  MPIABI_StatusPtr status)

{
  int iVar1;
  undefined4 in_register_0000003c;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Testany(CONCAT44(in_register_0000003c,count));
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Testany(int count, MPIABI_Request array_of_requests[],
                              int *indx, int *flag, MPIABI_StatusPtr status) {
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  const int ierr = MPI_Testany(count, reqs, indx, flag, (WPI_StatusPtr)status);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  return ierr;
}